

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# evaluator.cpp
# Opt level: O3

void __thiscall
despot::Planner::EvaluationLoop
          (Planner *this,DSPOMDP *model,World *world,Belief *belief,string *belief_type,
          Solver **solver,Logger *logger,Option *options,clock_t main_clock_start,int num_runs,
          int start_run)

{
  pointer pcVar1;
  int iVar2;
  long lVar3;
  ostream *poVar4;
  Belief *pBVar5;
  log_ostream *plVar6;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  size_t sVar7;
  undefined8 uVar8;
  char *__s;
  double extraout_XMM0_Qa;
  vector<double,_std::allocator<double>_> round_rewards;
  timeval local_c0;
  int local_ac;
  double local_a8;
  double local_a0;
  double local_98;
  double local_90;
  Planner *local_88;
  long local_80;
  long *local_78 [2];
  long local_68 [2];
  DSPOMDP *local_58;
  long local_50;
  vector<double,_std::allocator<double>_> local_48;
  
  local_88 = this;
  std::vector<double,_std::allocator<double>_>::vector
            (&local_48,(long)num_runs,(allocator_type *)&local_c0);
  if ((long)num_runs < 1) {
    if (local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
        ._M_start == (pointer)0x0) {
      return;
    }
  }
  else {
    local_ac = 1;
    lVar3 = (long)start_run;
    local_50 = (long)(num_runs + start_run);
    local_58 = model;
    do {
      local_88->round_ = (int)lVar3;
      local_88->step_ = 0;
      local_80 = lVar3;
      if (DAT_00192e10 == '\0') {
        std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '\x10');
        std::ostream::put('\x10');
        poVar4 = (ostream *)std::ostream::flush();
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar4,"####################################### Round ",0x2e);
        poVar4 = (ostream *)std::ostream::operator<<(poVar4,(int)local_80);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar4," #######################################",0x28);
        std::ios::widen((char)poVar4->_vptr_basic_ostream[-3] + (char)poVar4);
        std::ostream::put((char)poVar4);
        std::ostream::flush();
      }
      (*world->_vptr_World[3])(world);
      (*world->_vptr_World[4])(world);
      (*logger->_vptr_Logger[2])();
      gettimeofday(&local_c0,(__timezone_ptr_t)0x0);
      local_98 = (double)local_c0.tv_sec;
      local_90 = (double)local_c0.tv_usec / 1000000.0;
      pBVar5 = Solver::belief(*solver);
      if (pBVar5 != (Belief *)0x0) {
        (*pBVar5->_vptr_Belief[1])(pBVar5);
      }
      gettimeofday(&local_c0,(__timezone_ptr_t)0x0);
      local_a8 = (double)local_c0.tv_sec;
      local_a0 = (double)local_c0.tv_usec / 1000000.0;
      iVar2 = logging::level();
      if ((local_ac <= iVar2) && (iVar2 = logging::level(), 2 < iVar2)) {
        plVar6 = logging::stream(3);
        std::__ostream_insert<char,std::char_traits<char>>
                  (&plVar6->super_ostream,"[Initializer::EvaluationLoop] Deleted old belief in ",
                   0x34);
        poVar4 = std::ostream::_M_insert<double>((local_a0 + local_a8) - (local_90 + local_98));
        std::__ostream_insert<char,std::char_traits<char>>(poVar4,"s",1);
        std::ios::widen((char)poVar4->_vptr_basic_ostream[-3] + (char)poVar4);
        std::ostream::put((char)poVar4);
        std::ostream::flush();
      }
      gettimeofday(&local_c0,(__timezone_ptr_t)0x0);
      local_98 = (double)local_c0.tv_sec;
      local_90 = (double)local_c0.tv_usec / 1000000.0;
      iVar2 = (*world->_vptr_World[4])(world);
      local_78[0] = local_68;
      pcVar1 = (belief_type->_M_dataplus)._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_78,pcVar1,pcVar1 + belief_type->_M_string_length);
      iVar2 = (*model->_vptr_DSPOMDP[9])(model,CONCAT44(extraout_var,iVar2),local_78);
      pBVar5 = (Belief *)CONCAT44(extraout_var_00,iVar2);
      if (local_78[0] != local_68) {
        operator_delete(local_78[0],local_68[0] + 1);
      }
      gettimeofday(&local_c0,(__timezone_ptr_t)0x0);
      local_a8 = (double)local_c0.tv_sec;
      local_a0 = (double)local_c0.tv_usec / 1000000.0;
      iVar2 = logging::level();
      if ((local_ac <= iVar2) && (iVar2 = logging::level(), 2 < iVar2)) {
        plVar6 = logging::stream(3);
        std::__ostream_insert<char,std::char_traits<char>>
                  (&plVar6->super_ostream,"[Initializer::EvaluationLoop] Created intial belief ",
                   0x34);
        if (pBVar5 == (Belief *)0x0) {
          uVar8 = __cxa_bad_typeid();
          if (local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_start,
                            (long)local_48.super__Vector_base<double,_std::allocator<double>_>.
                                  _M_impl.super__Vector_impl_data._M_end_of_storage -
                            (long)local_48.super__Vector_base<double,_std::allocator<double>_>.
                                  _M_impl.super__Vector_impl_data._M_start);
          }
          _Unwind_Resume(uVar8);
        }
        __s = *(char **)(pBVar5->_vptr_Belief[-1] + 8) +
              (**(char **)(pBVar5->_vptr_Belief[-1] + 8) == '*');
        sVar7 = strlen(__s);
        std::__ostream_insert<char,std::char_traits<char>>(&plVar6->super_ostream,__s,sVar7);
        model = local_58;
        std::__ostream_insert<char,std::char_traits<char>>(&plVar6->super_ostream," in ",4);
        poVar4 = std::ostream::_M_insert<double>((local_a0 + local_a8) - (local_90 + local_98));
        std::__ostream_insert<char,std::char_traits<char>>(poVar4,"s",1);
        std::ios::widen((char)poVar4->_vptr_basic_ostream[-3] + (char)poVar4);
        std::ostream::put((char)poVar4);
        std::ostream::flush();
      }
      (*(*solver)->_vptr_Solver[4])(*solver,pBVar5);
      logger->belief_ = pBVar5;
      (*(local_88->super_PlannerBase)._vptr_PlannerBase[8])(local_88,solver,world);
      if (DAT_00192e10 == '\0') {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"Simulation terminated in ",0x19);
        poVar4 = (ostream *)std::ostream::operator<<(&std::cout,logger->step_);
        std::__ostream_insert<char,std::char_traits<char>>(poVar4," steps",6);
        std::ios::widen((char)poVar4->_vptr_basic_ostream[-3] + (char)poVar4);
        std::ostream::put((char)poVar4);
        std::ostream::flush();
      }
      (*logger->_vptr_Logger[3])();
      local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start[local_80] = extraout_XMM0_Qa;
      lVar3 = local_80 + 1;
    } while (lVar3 < local_50);
  }
  operator_delete(local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start,
                  (long)local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_end_of_storage -
                  (long)local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start);
  return;
}

Assistant:

void Planner::EvaluationLoop(DSPOMDP *model, World* world, Belief* belief,
		string belief_type, Solver *&solver, Logger *logger,
		option::Option *options, clock_t main_clock_start, int num_runs,
		int start_run) {
	// Run num_runs simulations
	vector<double> round_rewards(num_runs);
	for (int round = start_run; round < start_run + num_runs; round++) {
		round_=round;
		step_=0;
		default_out<< endl
		<< "####################################### Round " << round
		<< " #######################################" << endl;
		//Reset world and logger
		world->Initialize();
		logger->InitRound(world->GetCurrentState());

		//Reset belief and solver
		double start_t = get_time_second();
		delete solver->belief();
		double end_t = get_time_second();
		logi << "[Initializer::EvaluationLoop] Deleted old belief in "
		<< (end_t - start_t) << "s" << endl;

		start_t = get_time_second();
		belief=model->InitialBelief(world->GetCurrentState(), belief_type);
		end_t = get_time_second();
		logi << "[Initializer::EvaluationLoop] Created intial belief "
		<< typeid(*belief).name() << " in " << (end_t - start_t) << "s" << endl;

		solver->belief(belief);
		logger->belief(belief);

		//start loop
		PlanningLoop(solver, world, logger);
		//end loop

		default_out << "Simulation terminated in " << logger->step() << " steps"
		<< endl;
		double round_reward = logger->EndRound();
		round_rewards[round] = round_reward;
	}
}